

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall google::protobuf::io::CordInputStream::BackUp(CordInputStream *this,int count)

{
  string *psVar1;
  ulong uVar2;
  CordInputStream *this_00;
  ulong uVar3;
  
  uVar3 = (ulong)count;
  uVar2 = this->size_ - this->available_;
  if (uVar2 < uVar3) {
    psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (uVar3,uVar2,"static_cast<size_t>(count) <= size_ - available_");
  }
  else {
    psVar1 = (string *)0x0;
  }
  if (psVar1 == (string *)0x0) {
    this->available_ = this->available_ + uVar3;
    this->bytes_remaining_ = this->bytes_remaining_ + uVar3;
    return;
  }
  this_00 = (CordInputStream *)&stack0xffffffffffffffe0;
  BackUp();
  uVar2 = (ulong)(int)psVar1;
  if (this_00->available_ < uVar2) {
    if (this_00->bytes_remaining_ < uVar2) {
      NextChunk(this_00,this_00->bytes_remaining_);
    }
    else {
      NextChunk(this_00,uVar2);
    }
    return;
  }
  this_00->available_ = this_00->available_ - uVar2;
  this_00->bytes_remaining_ = this_00->bytes_remaining_ - uVar2;
  return;
}

Assistant:

void CordInputStream::BackUp(int count) {
  // Backup is only allowed on last returned chunk from `Next()`.
  ABSL_CHECK_LE(static_cast<size_t>(count), size_ - available_);

  available_ += count;
  bytes_remaining_ += count;
}